

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

void MemPage_destroy(MemPage *page)

{
  MemPage *page_local;
  
  deFree(page);
  return;
}

Assistant:

static void MemPage_destroy (MemPage* page)
{
#if defined(DE_DEBUG)
	/* Fill with garbage to hopefully catch dangling pointer bugs easier. */
	deUint8* dataPtr = (deUint8*)(page + 1);
	memset(dataPtr, 0xCD, (size_t)page->capacity);
#endif
	deFree(page);
}